

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<Statement> __thiscall Parser::localDecl(Parser *this,TokenType tokenType)

{
  undefined8 uVar1;
  int in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  Parser *this_00;
  ptr<Statement> pVar2;
  bool constant;
  Identifier identifier;
  ptr<Expression> expr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48 [2];
  _Alloc_hider local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_20;
  
  this_00 = (Parser *)CONCAT44(in_register_00000034,tokenType);
  constant = in_EDX == 0x2b;
  consume(this_00);
  Token::Token((Token *)&expr,&this_00->currentToken);
  identifier._M_dataplus._M_p = (pointer)&identifier.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expr.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
      local_48) {
    identifier.field_2._8_8_ = local_48[0]._8_8_;
  }
  else {
    identifier._M_dataplus._M_p =
         (pointer)expr.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  local_48[0]._M_local_buf[0] = '\0';
  expr.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48;
  std::__cxx11::string::~string
            ((string *)&expr.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  consume(this_00,Identifier,"identifier");
  consume(this_00,Assign,"assignment operator \'=\'");
  expression((Parser *)&expr);
  consume(this_00,StatEnd,"\';\'");
  std::
  make_shared<LocalDeclarationStatement,std::__cxx11::string&,bool&,std::shared_ptr<Expression>&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28,
             (bool *)&identifier,(shared_ptr<Expression> *)&constant);
  uVar1 = aStack_20._M_allocated_capacity;
  aStack_20._M_allocated_capacity = 0;
  (this->filepath)._M_dataplus._M_p = local_28._M_p;
  (this->filepath)._M_string_length = uVar1;
  local_28._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aStack_20._M_allocated_capacity);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&expr.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&identifier);
  pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::localDecl(TokenType tokenType) {
    bool constant = tokenType == TokenType::Const;
    consume();
    Identifier identifier = token().lexeme;
    consume(TokenType::Identifier, "identifier");
    consume(TokenType::Assign, "assignment operator '='");
    ptr<Expression> expr = expression();
    consume(TokenType::StatEnd, "';'");
    return make<LocalDeclarationStatement>(identifier, constant, expr);
}